

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::deriveEDDSA
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hBaseKey,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_KEY_TYPE keyType,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  uchar uVar1;
  CK_ATTRIBUTE_TYPE CVar2;
  ulong uVar3;
  void *pvVar4;
  CK_KEY_TYPE CVar5;
  byte bVar6;
  char cVar7;
  bool value_00;
  int iVar8;
  Session *this_00;
  OSObject *pOVar9;
  CryptoFactory *pCVar10;
  SoftHSM *pSVar11;
  EDPrivateKey *privateKey;
  CK_RV CVar12;
  uchar *puVar13;
  EDPublicKey *publicKey;
  long *plVar14;
  ByteString *in;
  size_t sVar15;
  byte *pbVar16;
  unsigned_long *puVar17;
  ulong uVar18;
  CK_ULONG CVar19;
  CK_ULONG CVar20;
  size_t i;
  undefined7 uVar22;
  undefined8 uVar21;
  SoftHSM *this_01;
  char *pcVar23;
  ByteString secretValue;
  ByteString plainKCV;
  ByteString kcv;
  ByteString value;
  CK_OBJECT_CLASS objClass;
  ByteString publicData;
  CK_ATTRIBUTE secretAttribs [32];
  ulong local_518;
  long *local_508;
  SoftHSM *local_500;
  OSObject *local_4f8;
  Token *local_4f0;
  uint local_4e4;
  ByteString local_4e0;
  CK_RV local_4b8;
  CK_SESSION_HANDLE local_4b0;
  undefined1 local_4a8 [160];
  ByteString local_408;
  ByteString local_3e0;
  ByteString local_3b8;
  undefined8 local_390;
  ByteString local_388;
  ByteString local_360;
  _CK_ATTRIBUTE local_338;
  undefined8 local_320;
  CK_BBOOL *local_318;
  undefined8 local_310;
  undefined8 local_308;
  CK_BBOOL *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  CK_KEY_TYPE *local_2e8;
  undefined8 local_2e0;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  CVar5 = keyType;
  *phKey = 0;
  plVar14 = (long *)pMechanism->pParameter;
  if ((plVar14 == (long *)0x0) || (pMechanism->ulParameterLen != 0x28)) {
    pcVar23 = "pParameter must be of type CK_ECDH1_DERIVE_PARAMS";
    iVar8 = 0x2ada;
LAB_00146453:
    softHSMLog(7,"deriveEDDSA",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,iVar8,pcVar23);
    return 0x71;
  }
  if (*plVar14 != 1) {
    pcVar23 = "kdf must be CKD_NULL";
    iVar8 = 0x2adf;
    goto LAB_00146453;
  }
  if ((plVar14[1] != 0) || (plVar14[2] != 0)) {
    pcVar23 = "there must be no shared data";
    iVar8 = 0x2ae5;
    goto LAB_00146453;
  }
  if ((plVar14[3] == 0) || (plVar14[4] == 0)) {
    pcVar23 = "there must be a public data";
    iVar8 = 0x2aeb;
    goto LAB_00146453;
  }
  local_4b0 = hSession;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  local_500 = this;
  local_4f0 = Session::getToken(this_00);
  if (local_4f0 == (Token *)0x0) {
    return 5;
  }
  uVar22 = (undefined7)((ulong)this_00 >> 8);
  if (ulCount == 0) {
    local_4e4 = (uint)CONCAT71(uVar22,1);
    uVar18 = 0;
  }
  else {
    puVar17 = &pTemplate->ulValueLen;
    uVar21 = CONCAT71(uVar22,1);
    uVar18 = 0;
    CVar20 = ulCount;
    do {
      CVar2 = ((_CK_ATTRIBUTE *)(puVar17 + -2))->type;
      if (CVar2 == 0x90) {
        if (*puVar17 != 0) {
          pcVar23 = "CKA_CHECK_VALUE must be a no-value (0 length) entry";
          iVar8 = 0x2b0e;
LAB_00146702:
          softHSMLog(6,"deriveEDDSA",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,iVar8,pcVar23);
          return 0x13;
        }
        uVar21 = 0;
      }
      else if (CVar2 == 0x161) {
        if (*puVar17 != 8) {
          pcVar23 = "CKA_VALUE_LEN does not have the size of CK_ULONG";
          iVar8 = 0x2b06;
          goto LAB_00146702;
        }
        uVar18 = *(ulong *)puVar17[-1];
      }
      else if (CVar2 == 0x11) {
        softHSMLog(6,"deriveEDDSA",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x2b01,"CKA_VALUE must not be included");
        return 0x10;
      }
      local_4e4 = (uint)uVar21;
      puVar17 = puVar17 + 3;
      CVar20 = CVar20 - 1;
    } while (CVar20 != 0);
  }
  local_518 = uVar18;
  switch(CVar5) {
  case 0x10:
    break;
  case 0x11:
  case 0x12:
    return 0x13;
  case 0x13:
    if ((uVar18 & 0xfffffffffffffff7) != 0) {
      pcVar23 = "CKA_VALUE_LEN must be 0 or 8";
      iVar8 = 0x2b22;
LAB_00146685:
      softHSMLog(6,"deriveEDDSA",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,iVar8,pcVar23);
      return 0x13;
    }
    local_518 = 8;
    break;
  case 0x14:
    if ((uVar18 & 0xffffffffffffffef) != 0) {
      pcVar23 = "CKA_VALUE_LEN must be 0 or 16";
      iVar8 = 0x2b2b;
      goto LAB_00146685;
    }
    local_518 = 0x10;
    break;
  case 0x15:
    local_518 = 0x18;
    if ((uVar18 != 0) && (uVar18 != 0x18)) {
      pcVar23 = "CKA_VALUE_LEN must be 0 or 24";
      iVar8 = 0x2b33;
      goto LAB_00146685;
    }
    break;
  default:
    if (CVar5 != 0x1f) {
      return 0x13;
    }
    uVar18 = uVar18 << 0x3d | uVar18 >> 3;
    if ((4 < uVar18) || (uVar18 == 1)) {
      pcVar23 = "CKA_VALUE_LEN must be 0, 16, 24, or 32";
      iVar8 = 0x2b3b;
      goto LAB_00146685;
    }
  }
  pOVar9 = (OSObject *)HandleManager::getObject(local_500->handleManager,hBaseKey);
  if (pOVar9 == (OSObject *)0x0) {
    return 0x60;
  }
  iVar8 = (*pOVar9->_vptr_OSObject[10])(pOVar9);
  if ((char)iVar8 == '\0') {
    return 0x60;
  }
  pCVar10 = CryptoFactory::i();
  iVar8 = (*pCVar10->_vptr_CryptoFactory[2])(pCVar10,7);
  pSVar11 = (SoftHSM *)CONCAT44(extraout_var,iVar8);
  if (pSVar11 == (SoftHSM *)0x0) {
    return 0x70;
  }
  this_01 = pSVar11;
  local_4f8 = pOVar9;
  iVar8 = (*pSVar11->_vptr_SoftHSM[0x16])();
  privateKey = (EDPrivateKey *)CONCAT44(extraout_var_00,iVar8);
  if (privateKey == (EDPrivateKey *)0x0) {
    pCVar10 = CryptoFactory::i();
    (*pCVar10->_vptr_CryptoFactory[3])(pCVar10,pSVar11);
    return 2;
  }
  CVar12 = getEDPrivateKey(this_01,privateKey,local_4f0,local_4f8);
  if (CVar12 != 0) {
    (*pSVar11->_vptr_SoftHSM[0x1b])(pSVar11,privateKey);
    pCVar10 = CryptoFactory::i();
    (*pCVar10->_vptr_CryptoFactory[3])(pCVar10,pSVar11);
    return 5;
  }
  ByteString::ByteString(&local_388);
  ByteString::resize(&local_388,*(size_t *)((long)pMechanism->pParameter + 0x18));
  puVar13 = ByteString::operator[](&local_388,0);
  memcpy(puVar13,*(void **)((long)pMechanism->pParameter + 0x20),
         *(size_t *)((long)pMechanism->pParameter + 0x18));
  iVar8 = (*pSVar11->_vptr_SoftHSM[0x15])();
  publicKey = (EDPublicKey *)CONCAT44(extraout_var_01,iVar8);
  if (publicKey == (EDPublicKey *)0x0) {
    (*pSVar11->_vptr_SoftHSM[0x1b])(pSVar11,privateKey);
    pCVar10 = CryptoFactory::i();
    CVar12 = 2;
    (*pCVar10->_vptr_CryptoFactory[3])(pCVar10,pSVar11);
    goto LAB_001468e6;
  }
  CVar12 = getEDDHPublicKey(local_500,publicKey,privateKey,&local_388);
  if (CVar12 != 0) {
    (*pSVar11->_vptr_SoftHSM[0x1b])(pSVar11,privateKey);
    (*pSVar11->_vptr_SoftHSM[0x1a])(pSVar11,publicKey);
    pCVar10 = CryptoFactory::i();
    CVar12 = 5;
    (*pCVar10->_vptr_CryptoFactory[3])(pCVar10,pSVar11);
    goto LAB_001468e6;
  }
  local_508 = (long *)0x0;
  iVar8 = (*pSVar11->_vptr_SoftHSM[0x10])(pSVar11,&local_508,publicKey,privateKey);
  (*pSVar11->_vptr_SoftHSM[0x1b])(pSVar11,privateKey);
  (*pSVar11->_vptr_SoftHSM[0x1a])();
  local_4b8 = (ulong)(byte)((byte)iVar8 ^ 1) * 5;
  local_390 = 4;
  memset(&local_338,0,0x300);
  local_338.ulValueLen = 8;
  local_320 = 1;
  local_318 = &isOnToken;
  local_310 = 1;
  local_308 = 2;
  local_300 = &isPrivate;
  local_2f8 = 1;
  local_2f0 = 0x100;
  local_2e8 = &keyType;
  local_2e0 = 8;
  CVar12 = 0xd1;
  if (ulCount < 0x1d) {
    CVar12 = local_4b8;
  }
  bVar6 = ulCount < 0x1d & (byte)iVar8;
  CVar20 = 4;
  if (ulCount != 0 && bVar6 == 1) {
    uVar18 = 0;
    CVar19 = CVar20;
    do {
      uVar3 = pTemplate->type;
      CVar20 = CVar19;
      if (((2 < uVar3) && (uVar3 != 0x90)) && (uVar3 != 0x100)) {
        CVar20 = CVar19 + 1;
        (&local_338)[CVar19].ulValueLen = pTemplate->ulValueLen;
        pvVar4 = pTemplate->pValue;
        (&local_338)[CVar19].type = pTemplate->type;
        (&local_338)[CVar19].pValue = pvVar4;
      }
      uVar18 = uVar18 + 1;
      pTemplate = pTemplate + 1;
      CVar19 = CVar20;
    } while (uVar18 < ulCount);
  }
  local_338.pValue = &local_390;
  if ((bVar6 != 0) &&
     (CVar12 = CreateObject(local_500,local_4b0,&local_338,CVar20,phKey,3), CVar12 == 0)) {
    plVar14 = (long *)HandleManager::getObject(local_500->handleManager,*phKey);
    CVar12 = 6;
    if ((plVar14 != (long *)0x0) &&
       ((cVar7 = (**(code **)(*plVar14 + 0x50))(plVar14), cVar7 != '\0' &&
        (cVar7 = (**(code **)(*plVar14 + 0x58))(plVar14), cVar7 != '\0')))) {
      OSAttribute::OSAttribute((OSAttribute *)local_4a8,false);
      cVar7 = (**(code **)(*plVar14 + 0x40))(plVar14,0x163,local_4a8);
      OSAttribute::~OSAttribute((OSAttribute *)local_4a8);
      iVar8 = (*local_4f8->_vptr_OSObject[4])(local_4f8,0x165,0);
      if ((char)iVar8 == '\0') {
        if (cVar7 == '\0') goto LAB_00146c16;
        OSAttribute::OSAttribute((OSAttribute *)local_4a8,false);
        cVar7 = (**(code **)(*plVar14 + 0x40))(plVar14,0x165,local_4a8);
LAB_00146c08:
        OSAttribute::~OSAttribute((OSAttribute *)local_4a8);
      }
      else {
        value_00 = (bool)(**(code **)(*plVar14 + 0x20))(plVar14,0x103,0);
        if (cVar7 != '\0') {
          OSAttribute::OSAttribute((OSAttribute *)local_4a8,value_00);
          cVar7 = (**(code **)(*plVar14 + 0x40))(plVar14,0x165,local_4a8);
          goto LAB_00146c08;
        }
LAB_00146c16:
        cVar7 = '\0';
      }
      iVar8 = (*local_4f8->_vptr_OSObject[4])(local_4f8,0x164,1);
      if ((char)iVar8 == '\0') {
        if (cVar7 == '\0') goto LAB_00146c9e;
        OSAttribute::OSAttribute((OSAttribute *)local_4a8,false);
        cVar7 = (**(code **)(*plVar14 + 0x40))(plVar14,0x164,local_4a8);
LAB_00146c8f:
        OSAttribute::~OSAttribute((OSAttribute *)local_4a8);
      }
      else {
        bVar6 = (**(code **)(*plVar14 + 0x20))(plVar14,0x162,0);
        if (cVar7 != '\0') {
          OSAttribute::OSAttribute((OSAttribute *)local_4a8,(bool)(bVar6 ^ 1));
          cVar7 = (**(code **)(*plVar14 + 0x40))(plVar14,0x164,local_4a8);
          goto LAB_00146c8f;
        }
LAB_00146c9e:
        cVar7 = '\0';
      }
      in = (ByteString *)(**(code **)(*local_508 + 0x20))();
      ByteString::ByteString(&local_4e0,in);
      ByteString::ByteString(&local_3b8);
      ByteString::ByteString(&local_408);
      ByteString::ByteString(&local_3e0);
      if (local_518 == 0) {
        if (keyType == 0x10) {
          local_518 = ByteString::size(&local_4e0);
        }
        else if (keyType == 0x1f) {
          sVar15 = ByteString::size(&local_4e0);
          local_518 = 0x20;
          if (sVar15 < 0x20) {
            sVar15 = ByteString::size(&local_4e0);
            local_518 = (ulong)(0x17 < sVar15) * 8 + 0x10;
          }
        }
        else {
          local_518 = 0;
        }
      }
      sVar15 = ByteString::size(&local_4e0);
      if (sVar15 < local_518) {
        softHSMLog(6,"deriveEDDSA",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x2bd2,"The derived secret is too short");
LAB_0014702e:
        (**(code **)(*plVar14 + 0x68))(plVar14);
        CVar12 = 6;
      }
      else {
        sVar15 = ByteString::size(&local_4e0);
        if (local_518 < sVar15) {
          sVar15 = ByteString::size(&local_4e0);
          ByteString::split(&local_360,&local_4e0,sVar15 - local_518);
          local_360._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
          std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                    (&local_360.byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        }
        if (keyType - 0x13 < 3) {
          for (uVar18 = 0; sVar15 = ByteString::size(&local_4e0), uVar18 < sVar15;
              uVar18 = uVar18 + 1) {
            pbVar16 = ByteString::operator[](&local_4e0,uVar18);
            uVar1 = odd_parity[*pbVar16];
            puVar13 = ByteString::operator[](&local_4e0,uVar18);
            *puVar13 = uVar1;
          }
        }
        if (keyType - 0x13 < 3) {
          (**(code **)(*local_508 + 0x30))(local_508,local_518 * 7);
          (**(code **)(*local_508 + 0x28))(local_4a8);
          ByteString::operator=(&local_408,(ByteString *)local_4a8);
LAB_00146f1b:
          local_4a8._0_8_ = &PTR__ByteString_0019d880;
          std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)(local_4a8 + 8)
                    );
        }
        else {
          if (keyType == 0x1f) {
            (**(code **)(*local_508 + 0x30))(local_508,local_518 << 3);
            (**(code **)(*local_508 + 0x28))(local_4a8);
            ByteString::operator=(&local_408,(ByteString *)local_4a8);
            goto LAB_00146f1b;
          }
          if (keyType == 0x10) {
            (**(code **)(*local_508 + 0x30))(local_508,local_518 << 3);
            (**(code **)(*local_508 + 0x28))(local_4a8);
            ByteString::operator=(&local_408,(ByteString *)local_4a8);
            goto LAB_00146f1b;
          }
          cVar7 = '\0';
        }
        if (isPrivate == '\0') {
          ByteString::operator=(&local_3b8,&local_4e0);
          ByteString::operator=(&local_3e0,&local_408);
        }
        else {
          Token::encrypt(local_4f0,(char *)&local_4e0,(int)&local_3b8);
          Token::encrypt(local_4f0,(char *)&local_408,(int)&local_3e0);
        }
        if (cVar7 == '\0') goto LAB_0014702e;
        OSAttribute::OSAttribute((OSAttribute *)local_4a8,&local_3b8);
        cVar7 = (**(code **)(*plVar14 + 0x40))(plVar14,0x11,local_4a8);
        OSAttribute::~OSAttribute((OSAttribute *)local_4a8);
        if ((local_4e4 & 1) != 0) {
          if (cVar7 == '\0') goto LAB_0014702e;
          OSAttribute::OSAttribute((OSAttribute *)local_4a8,&local_3e0);
          cVar7 = (**(code **)(*plVar14 + 0x40))(plVar14,0x90,local_4a8);
          OSAttribute::~OSAttribute((OSAttribute *)local_4a8);
        }
        if (cVar7 == '\0') goto LAB_0014702e;
        cVar7 = (**(code **)(*plVar14 + 0x60))(plVar14);
        CVar12 = 6;
        if (cVar7 != '\0') {
          CVar12 = 0;
        }
      }
      local_3e0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_3e0.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      local_408._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_408.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      local_3b8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_3b8.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      local_4e0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_4e0.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    }
  }
  (*pSVar11->_vptr_SoftHSM[0x1c])(pSVar11,local_508);
  pCVar10 = CryptoFactory::i();
  (*pCVar10->_vptr_CryptoFactory[3])(pCVar10,pSVar11);
  if ((CVar12 != 0) && (*phKey != 0)) {
    plVar14 = (long *)HandleManager::getObject(local_500->handleManager,*phKey);
    HandleManager::destroyObject(local_500->handleManager,*phKey);
    if (plVar14 != (long *)0x0) {
      (**(code **)(*plVar14 + 0x70))(plVar14);
    }
    *phKey = 0;
  }
LAB_001468e6:
  local_388._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_388.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return CVar12;
}

Assistant:

CK_RV SoftHSM::deriveEDDSA
(CK_SESSION_HANDLE hSession,
	CK_MECHANISM_PTR pMechanism,
	CK_OBJECT_HANDLE hBaseKey,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_KEY_TYPE keyType,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	if ((pMechanism->pParameter == NULL_PTR) ||
	    (pMechanism->ulParameterLen != sizeof(CK_ECDH1_DERIVE_PARAMS)))
	{
		DEBUG_MSG("pParameter must be of type CK_ECDH1_DERIVE_PARAMS");
		return CKR_MECHANISM_PARAM_INVALID;
	}
	if (CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->kdf != CKD_NULL)
	{
		DEBUG_MSG("kdf must be CKD_NULL");
		return CKR_MECHANISM_PARAM_INVALID;
	}
	if ((CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulSharedDataLen != 0) ||
	    (CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->pSharedData != NULL_PTR))
	{
		DEBUG_MSG("there must be no shared data");
		return CKR_MECHANISM_PARAM_INVALID;
	}
	if ((CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulPublicDataLen == 0) ||
	    (CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->pPublicData == NULL_PTR))
	{
		DEBUG_MSG("there must be a public data");
		return CKR_MECHANISM_PARAM_INVALID;
	}

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	size_t byteLen = 0;
	bool checkValue = true;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_VALUE:
				INFO_MSG("CKA_VALUE must not be included");
				return CKR_ATTRIBUTE_READ_ONLY;
			case CKA_VALUE_LEN:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_VALUE_LEN does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				byteLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			case CKA_CHECK_VALUE:
				if (pTemplate[i].ulValueLen > 0)
				{
					INFO_MSG("CKA_CHECK_VALUE must be a no-value (0 length) entry");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				checkValue = false;
				break;
			default:
				break;
		}
	}

	// Check the length
	// byteLen == 0 impiles return max size the ECC can derive
	switch (keyType)
	{
		case CKK_GENERIC_SECRET:
			break;
#ifndef WITH_FIPS
		case CKK_DES:
			if (byteLen != 0 && byteLen != 8)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0 or 8");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			byteLen = 8;
			break;
#endif
		case CKK_DES2:
			if (byteLen != 0 && byteLen != 16)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0 or 16");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			byteLen = 16;
			break;
		case CKK_DES3:
			if (byteLen != 0 && byteLen != 24)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0 or 24");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			byteLen = 24;
			break;
		case CKK_AES:
			if (byteLen != 0 && byteLen != 16 && byteLen != 24 && byteLen != 32)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0, 16, 24, or 32");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			break;
		default:
			return CKR_ATTRIBUTE_VALUE_INVALID;
	}

	// Get the base key handle
	OSObject *baseKey = (OSObject *)handleManager->getObject(hBaseKey);
	if (baseKey == NULL || !baseKey->isValid())
		return CKR_KEY_HANDLE_INVALID;

	// Get the EDDSA algorithm handler
	AsymmetricAlgorithm* eddsa = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::EDDSA);
	if (eddsa == NULL)
		return CKR_MECHANISM_INVALID;

	// Get the keys
	PrivateKey* privateKey = eddsa->newPrivateKey();
	if (privateKey == NULL)
	{
		CryptoFactory::i()->recycleAsymmetricAlgorithm(eddsa);
		return CKR_HOST_MEMORY;
	}
	if (getEDPrivateKey((EDPrivateKey*)privateKey, token, baseKey) != CKR_OK)
	{
		eddsa->recyclePrivateKey(privateKey);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(eddsa);
		return CKR_GENERAL_ERROR;
	}

	ByteString publicData;
	publicData.resize(CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulPublicDataLen);
	memcpy(&publicData[0],
	       CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->pPublicData,
	       CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulPublicDataLen);
	PublicKey* publicKey = eddsa->newPublicKey();
	if (publicKey == NULL)
	{
		eddsa->recyclePrivateKey(privateKey);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(eddsa);
		return CKR_HOST_MEMORY;
	}
	if (getEDDHPublicKey((EDPublicKey*)publicKey, (EDPrivateKey*)privateKey, publicData) != CKR_OK)
	{
		eddsa->recyclePrivateKey(privateKey);
		eddsa->recyclePublicKey(publicKey);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(eddsa);
		return CKR_GENERAL_ERROR;
	}

	// Derive the secret
	SymmetricKey* secret = NULL;
	CK_RV rv = CKR_OK;
	if (!eddsa->deriveKey(&secret, publicKey, privateKey))
		rv = CKR_GENERAL_ERROR;
	eddsa->recyclePrivateKey(privateKey);
	eddsa->recyclePublicKey(publicKey);

	// Create the secret object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_SECRET_KEY;
	CK_ATTRIBUTE secretAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG secretAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - secretAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
			case CKA_CHECK_VALUE:
				continue;
		default:
			secretAttribs[secretAttribsCount++] = pTemplate[i];
		}
	}

	if (rv == CKR_OK)
		rv = this->CreateObject(hSession, secretAttribs, secretAttribsCount, phKey, OBJECT_OP_DERIVE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,false);

			// Common Secret Key Attributes
			if (baseKey->getBooleanValue(CKA_ALWAYS_SENSITIVE, false))
			{
				bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
			}
			else
			{
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,false);
			}
			if (baseKey->getBooleanValue(CKA_NEVER_EXTRACTABLE, true))
			{
				bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE,bNeverExtractable);
			}
			else
			{
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE,false);
			}

			// Secret Attributes
			ByteString secretValue = secret->getKeyBits();
			ByteString value;
			ByteString plainKCV;
			ByteString kcv;

			// For generic and AES keys:
			// default to return max size available.
			if (byteLen == 0)
			{
				switch (keyType)
				{
					case CKK_GENERIC_SECRET:
						byteLen = secretValue.size();
						break;
					case CKK_AES:
						if (secretValue.size() >= 32)
							byteLen = 32;
						else if (secretValue.size() >= 24)
							byteLen = 24;
						else
							byteLen = 16;
				}
			}

			if (byteLen > secretValue.size())
			{
				INFO_MSG("The derived secret is too short");
				bOK = false;
			}
			else
			{
				// Truncate value when requested, remove from the leading end
				if (byteLen < secretValue.size())
					secretValue.split(secretValue.size() - byteLen);

				// Fix the odd parity for DES
				if (keyType == CKK_DES ||
				    keyType == CKK_DES2 ||
				    keyType == CKK_DES3)
				{
					for (size_t i = 0; i < secretValue.size(); i++)
					{
						secretValue[i] = odd_parity[secretValue[i]];
					}
				}

				// Get the KCV
				switch (keyType)
				{
					case CKK_GENERIC_SECRET:
						secret->setBitLen(byteLen * 8);
						plainKCV = secret->getKeyCheckValue();
						break;
					case CKK_DES:
					case CKK_DES2:
					case CKK_DES3:
						secret->setBitLen(byteLen * 7);
						plainKCV = ((DESKey*)secret)->getKeyCheckValue();
						break;
					case CKK_AES:
						secret->setBitLen(byteLen * 8);
						plainKCV = ((AESKey*)secret)->getKeyCheckValue();
						break;
					default:
						bOK = false;
						break;
				}

				if (isPrivate)
				{
					token->encrypt(secretValue, value);
					token->encrypt(plainKCV, kcv);
				}
				else
				{
					value = secretValue;
					kcv = plainKCV;
				}
			}
			bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			if (checkValue)
				bOK = bOK && osobject->setAttribute(CKA_CHECK_VALUE, kcv);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	eddsa->recycleSymmetricKey(secret);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(eddsa);

	// Remove secret that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* ossecret = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (ossecret) ossecret->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}